

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void pnga_median(Integer g_a,Integer g_b,Integer g_c,Integer g_m)

{
  Integer mhi [7];
  Integer mlo [7];
  Integer mndim;
  Integer mtype;
  Integer chi [7];
  Integer clo [7];
  Integer cndim;
  Integer ctype;
  Integer bhi [7];
  Integer blo [7];
  Integer bndim;
  Integer btype;
  Integer ahi [7];
  Integer alo [7];
  Integer andim;
  Integer atype;
  Integer *in_stack_00000ec0;
  Integer *in_stack_00000ec8;
  Integer in_stack_00000ed0;
  Integer *in_stack_00000ed8;
  Integer *in_stack_00000ee0;
  Integer in_stack_00000ee8;
  Integer in_stack_00000f00;
  Integer *in_stack_00000f08;
  Integer *in_stack_00000f10;
  Integer in_stack_00000f18;
  Integer *in_stack_00000f20;
  Integer *in_stack_00000f28;
  undefined8 local_238 [8];
  long local_1f8;
  undefined8 local_1a8 [8];
  long local_168;
  undefined8 local_118 [8];
  long local_d8;
  Integer *in_stack_ffffffffffffff68;
  Integer *in_stack_ffffffffffffff70;
  Integer *in_stack_ffffffffffffff78;
  Integer in_stack_ffffffffffffff80;
  long local_48;
  
  pnga_inquire(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
  pnga_inquire(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
  pnga_inquire(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
  pnga_inquire(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
  for (; local_48 != 0; local_48 = local_48 + -1) {
    *(undefined8 *)(&stack0xffffffffffffff78 + (local_48 + -1) * 8) = 1;
  }
  for (; local_d8 != 0; local_d8 = local_d8 + -1) {
    local_118[local_d8 + -1] = 1;
  }
  for (; local_168 != 0; local_168 = local_168 + -1) {
    local_1a8[local_168 + -1] = 1;
  }
  for (; local_1f8 != 0; local_1f8 = local_1f8 + -1) {
    local_238[local_1f8 + -1] = 1;
  }
  _ga_sync_begin = 1;
  pnga_median_patch(in_stack_00000ee8,in_stack_00000ee0,in_stack_00000ed8,in_stack_00000ed0,
                    in_stack_00000ec8,in_stack_00000ec0,in_stack_00000f00,in_stack_00000f08,
                    in_stack_00000f10,in_stack_00000f18,in_stack_00000f20,in_stack_00000f28);
  return;
}

Assistant:

void pnga_median(Integer g_a, Integer g_b, Integer g_c, Integer g_m){


   Integer atype, andim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer btype, bndim;
   Integer blo[MAXDIM],bhi[MAXDIM];
   Integer ctype, cndim;
   Integer clo[MAXDIM],chi[MAXDIM];
   Integer mtype, mndim;
   Integer mlo[MAXDIM],mhi[MAXDIM];

    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    pnga_inquire(g_c,  &ctype, &cndim, chi);
    pnga_inquire(g_m,  &mtype, &mndim, mhi);

    while(andim){
        alo[andim-1]=1;
        andim--;
    }

    while(bndim){
        blo[bndim-1]=1;
        bndim--;
    }

    while(cndim){
        clo[cndim-1]=1;
        cndim--;
    }

    while(mndim){
        mlo[mndim-1]=1;
        mndim--;
    }
    _ga_sync_begin = 1;
    pnga_median_patch(g_a, alo, ahi, g_b, blo, bhi, g_c, clo, chi, g_m, mlo, mhi);

}